

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O1

void curious_call_callbacks(curious_callback_type_t type,void *io_args)

{
  undefined8 *puVar1;
  int index;
  curious_dynamic_array_t callbacks;
  curious_dynamic_array_t local_38;
  
  local_38.last_el = callback_registry[type].last_el;
  local_38.len = callback_registry[type].len;
  local_38.el_size = callback_registry[type].el_size;
  local_38.array = callback_registry[type].array;
  if (-1 < local_38.last_el) {
    index = -1;
    do {
      index = index + 1;
      puVar1 = (undefined8 *)get_from_curious_dynamic_array(&local_38,index);
      (*(code *)*puVar1)(type,puVar1[1],io_args);
    } while (index < local_38.last_el);
  }
  return;
}

Assistant:

void curious_call_callbacks(curious_callback_type_t type, void* io_args)
{
    //lookup the list of registred functions of the specified type...
    curious_dynamic_array_t callbacks = callback_registry[type];

    //...and run every one
    for (int i = 0; i <= callbacks.last_el; ++i) {
        curious_callback_data_t* data = (curious_callback_data_t*) (get_from_curious_dynamic_array(&callbacks, i));

        //usr_data was registered with the function earlier,
        //io_args was just passed to the IO function in the main code
        data->callback(type, data->usr_args, io_args);
    }
}